

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O0

void __thiscall wasm::WasmSplitOptions::WasmSplitOptions(WasmSplitOptions *this)

{
  initializer_list<wasm::WasmSplitOptions::Mode> __l;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_00;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_01;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_02;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_03;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_04;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_05;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_06;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_07;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_08;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_09;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_10;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_11;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_12;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_13;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_14;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_15;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_16;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_17;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_18;
  initializer_list<wasm::WasmSplitOptions::Mode> __l_19;
  WasmSplitOptions *pWVar1;
  anon_class_8_1_8991fb9c local_1548;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1540;
  allocator<char> local_1519;
  string local_1518 [32];
  anon_class_8_1_8991fb9c local_14f8;
  Action local_14f0;
  allocator<char> local_14c9;
  string local_14c8;
  allocator<char> local_14a1;
  string local_14a0;
  allocator<char> local_1479;
  string local_1478;
  anon_class_8_1_8991fb9c local_1458;
  Action local_1450;
  allocator<char> local_1429;
  string local_1428;
  allocator<char> local_1401;
  string local_1400;
  allocator<char> local_13d9;
  string local_13d8;
  anon_class_8_1_8991fb9c local_13b8;
  Action local_13b0;
  allocator<wasm::WasmSplitOptions::Mode> local_1389;
  Mode local_1388 [2];
  iterator local_1380;
  size_type local_1378;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_1370;
  allocator<char> local_1351;
  string local_1350;
  allocator<char> local_1329;
  string local_1328;
  allocator<char> local_1301;
  string local_1300;
  anon_class_8_1_8991fb9c local_12e0;
  Action local_12d8;
  allocator<wasm::WasmSplitOptions::Mode> local_12b1;
  Mode local_12b0 [2];
  iterator local_12a8;
  size_type local_12a0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_1298;
  allocator<char> local_1279;
  string local_1278;
  allocator<char> local_1251;
  string local_1250;
  allocator<char> local_1229;
  string local_1228;
  anon_class_8_1_8991fb9c local_1208;
  Action local_1200;
  allocator<wasm::WasmSplitOptions::Mode> local_11d9;
  Mode local_11d8 [2];
  iterator local_11d0;
  size_type local_11c8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_11c0;
  allocator<char> local_11a1;
  string local_11a0;
  allocator<char> local_1179;
  string local_1178;
  allocator<char> local_1151;
  string local_1150;
  anon_class_8_1_8991fb9c local_1130;
  Action local_1128;
  allocator<wasm::WasmSplitOptions::Mode> local_1101;
  Mode local_1100 [2];
  iterator local_10f8;
  size_type local_10f0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_10e8;
  allocator<char> local_10c9;
  string local_10c8;
  allocator<char> local_10a1;
  string local_10a0;
  allocator<char> local_1079;
  string local_1078;
  anon_class_8_1_8991fb9c local_1058;
  Action local_1050;
  allocator<wasm::WasmSplitOptions::Mode> local_1029;
  Mode local_1028 [2];
  iterator local_1020;
  size_type local_1018;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_1010;
  allocator<char> local_ff1;
  string local_ff0;
  allocator<char> local_fc9;
  string local_fc8;
  allocator<char> local_fa1;
  string local_fa0;
  anon_class_8_1_8991fb9c local_f80;
  Action local_f78;
  allocator<wasm::WasmSplitOptions::Mode> local_f55;
  Mode local_f54;
  iterator local_f50;
  size_type local_f48;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_f40;
  allocator<char> local_f21;
  string local_f20;
  allocator<char> local_ef9;
  string local_ef8;
  allocator<char> local_ed1;
  string local_ed0;
  anon_class_8_1_8991fb9c local_eb0;
  Action local_ea8;
  allocator<wasm::WasmSplitOptions::Mode> local_e85;
  Mode local_e84;
  iterator local_e80;
  size_type local_e78;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_e70;
  allocator<char> local_e51;
  string local_e50;
  allocator<char> local_e29;
  string local_e28;
  allocator<char> local_e01;
  string local_e00;
  anon_class_8_1_8991fb9c local_de0;
  Action local_dd8;
  allocator<wasm::WasmSplitOptions::Mode> local_db5;
  Mode local_db4;
  iterator local_db0;
  size_type local_da8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_da0;
  allocator<char> local_d81;
  string local_d80;
  allocator<char> local_d59;
  string local_d58;
  allocator<char> local_d31;
  string local_d30;
  anon_class_8_1_8991fb9c local_d10;
  Action local_d08;
  allocator<wasm::WasmSplitOptions::Mode> local_ce5;
  Mode local_ce4;
  iterator local_ce0;
  size_type local_cd8;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_cd0;
  allocator<char> local_cb1;
  string local_cb0;
  allocator<char> local_c89;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  anon_class_8_1_8991fb9c local_c40;
  Action local_c38;
  allocator<wasm::WasmSplitOptions::Mode> local_c15;
  Mode local_c14;
  iterator local_c10;
  size_type local_c08;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_c00;
  allocator<char> local_be1;
  string local_be0;
  allocator<char> local_bb9;
  string local_bb8;
  allocator<char> local_b91;
  string local_b90;
  anon_class_8_1_8991fb9c local_b70;
  Action local_b68;
  allocator<wasm::WasmSplitOptions::Mode> local_b45;
  Mode local_b44;
  iterator local_b40;
  size_type local_b38;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_b30;
  allocator<char> local_b11;
  string local_b10;
  allocator<char> local_ae9;
  string local_ae8;
  allocator<char> local_ac1;
  string local_ac0;
  anon_class_8_1_8991fb9c local_aa0;
  Action local_a98;
  allocator<wasm::WasmSplitOptions::Mode> local_a75;
  Mode local_a74;
  iterator local_a70;
  size_type local_a68;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_a60;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  anon_class_8_1_8991fb9c local_9d0;
  Action local_9c8;
  allocator<wasm::WasmSplitOptions::Mode> local_9a1;
  Mode local_9a0 [2];
  iterator local_998;
  size_type local_990;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_988;
  allocator<char> local_969;
  string local_968;
  allocator<char> local_941;
  string local_940;
  allocator<char> local_919;
  string local_918;
  anon_class_8_1_8991fb9c local_8f8;
  Action local_8f0;
  allocator<wasm::WasmSplitOptions::Mode> local_8cd;
  Mode local_8cc;
  iterator local_8c8;
  size_type local_8c0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_8b8;
  allocator<char> local_899;
  string local_898;
  allocator<char> local_871;
  string local_870;
  allocator<char> local_849;
  string local_848;
  anon_class_8_1_8991fb9c local_828;
  Action local_820;
  allocator<wasm::WasmSplitOptions::Mode> local_7fd;
  Mode local_7fc;
  iterator local_7f8;
  size_type local_7f0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_7e8;
  allocator<char> local_7c9;
  string local_7c8;
  allocator<char> local_7a1;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  anon_class_8_1_8991fb9c local_758;
  Action local_750;
  allocator<wasm::WasmSplitOptions::Mode> local_72d;
  Mode local_72c;
  iterator local_728;
  size_type local_720;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_718;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  anon_class_8_1_8991fb9c local_688;
  Action local_680;
  allocator<wasm::WasmSplitOptions::Mode> local_65d;
  Mode local_65c;
  iterator local_658;
  size_type local_650;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_648;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  anon_class_8_1_8991fb9c local_5b8;
  Action local_5b0;
  allocator<wasm::WasmSplitOptions::Mode> local_58d;
  Mode local_58c;
  iterator local_588;
  size_type local_580;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_578;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  anon_class_8_1_8991fb9c local_4e8;
  Action local_4e0;
  allocator<wasm::WasmSplitOptions::Mode> local_4bd;
  Mode local_4bc;
  iterator local_4b8;
  size_type local_4b0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_4a8;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  anon_class_8_1_8991fb9c local_418;
  Action local_410;
  allocator<wasm::WasmSplitOptions::Mode> local_3ed;
  Mode local_3ec;
  iterator local_3e8;
  size_type local_3e0;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_3d8;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  anon_class_8_1_8991fb9c local_348;
  Action local_340;
  allocator<wasm::WasmSplitOptions::Mode> local_31d;
  Mode local_31c;
  iterator local_318;
  size_type local_310;
  vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_> local_308;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  anon_class_8_1_8991fb9c local_278;
  Action local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  anon_class_8_1_8991fb9c local_1d8;
  Action local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  anon_class_8_1_8991fb9c local_138;
  Action local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string WasmSplitOption;
  string local_68;
  allocator<char> local_31;
  string local_30;
  WasmSplitOptions *local_10;
  WasmSplitOptions *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"wasm-split",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "Split a module into a primary module and a secondary module, or instrument a module to gather a profile that can inform future splitting, or manage such profiles. Options that are only accepted in particular modes are marked with the accepted \"[<modes>]\" in their descriptions."
             ,(allocator<char> *)(WasmSplitOption.field_2._M_local_buf + 0xf));
  ToolOptions::ToolOptions(&this->super_ToolOptions,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)(WasmSplitOption.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this->mode = Split;
  this->storageKind = InGlobals;
  this->unescape = false;
  this->verbose = false;
  this->emitBinary = true;
  this->symbolMap = false;
  this->placeholderMap = false;
  this->jspi = false;
  this->emitModuleNames = false;
  std::__cxx11::string::string((string *)&this->profileFile);
  std::__cxx11::string::string
            ((string *)&this->profileExport,(string *)DEFAULT_PROFILE_EXPORT_abi_cxx11_);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set(&this->keepFuncs);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set(&this->splitFuncs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->inputFiles);
  std::__cxx11::string::string((string *)&this->output);
  std::__cxx11::string::string((string *)&this->primaryOutput);
  std::__cxx11::string::string((string *)&this->secondaryOutput);
  std::__cxx11::string::string((string *)&this->importNamespace);
  std::__cxx11::string::string((string *)&this->placeholderNamespace);
  std::__cxx11::string::string((string *)&this->secondaryMemoryName);
  std::__cxx11::string::string((string *)&this->exportPrefix);
  this->initialTableSize = -1;
  std::
  array<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL>
  ::array(&this->validOptions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->usedOptions);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"wasm-split options",&local_91);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"--split",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Split an input module into two output modules. The default mode."
             ,&local_109);
  local_138.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_130,&local_138);
  pWVar1 = add(this,&local_b8,&local_e0,&local_108,(string *)local_90,Zero,&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"--instrument",&local_159)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,
             "Instrument an input module to allow it to generate a profile that can be used to guide splitting."
             ,&local_1a9);
  local_1d8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1d0,&local_1d8);
  pWVar1 = add(pWVar1,&local_158,&local_180,&local_1a8,(string *)local_90,Zero,&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"--merge-profiles",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,
             "Merge multiple profiles for the same module into a single profile.",&local_249);
  local_278.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_270,&local_278);
  pWVar1 = add(pWVar1,&local_1f8,&local_220,&local_248,(string *)local_90,Zero,&local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"--print-profile",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"Print profile contents in a human-readable format.",&local_2e9);
  local_31c = PrintProfile;
  local_318 = &local_31c;
  local_310 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_31d);
  __l_19._M_len = local_310;
  __l_19._M_array = local_318;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_308,__l_19,&local_31d);
  local_348.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__3,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_340,&local_348);
  pWVar1 = add(pWVar1,&local_298,&local_2c0,&local_2e8,(string *)local_90,&local_308,One,&local_340)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"--profile",&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"",&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"The profile to use to guide splitting.",&local_3b9);
  local_3ec = Split;
  local_3e8 = &local_3ec;
  local_3e0 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_3ed);
  __l_18._M_len = local_3e0;
  __l_18._M_array = local_3e8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_3d8,__l_18,&local_3ed);
  local_418.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__4,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_410,&local_418);
  pWVar1 = add(pWVar1,&local_368,&local_390,&local_3b8,(string *)local_90,&local_3d8,One,&local_410)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"--keep-funcs",&local_439)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,
             "Comma-separated list of functions to keep in the primary module. The rest will be split out. Cannot be used with --profile or --split-funcs. You can also pass a file with one function per line by passing @filename."
             ,&local_489);
  local_4bc = Split;
  local_4b8 = &local_4bc;
  local_4b0 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_4bd);
  __l_17._M_len = local_4b0;
  __l_17._M_array = local_4b8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_4a8,__l_17,&local_4bd);
  local_4e8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__5,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_4e0,&local_4e8);
  pWVar1 = add(pWVar1,&local_438,&local_460,&local_488,(string *)local_90,&local_4a8,One,&local_4e0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"--split-funcs",&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"",&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,
             "Comma-separated list of functions to split out to the secondary module. The rest will be kept. Cannot be used with --profile or --keep-funcs. You can also pass a file with one function per line by passing @filename."
             ,&local_559);
  local_58c = Split;
  local_588 = &local_58c;
  local_580 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_58d);
  __l_16._M_len = local_580;
  __l_16._M_array = local_588;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_578,__l_16,&local_58d);
  local_5b8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__6,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_5b0,&local_5b8);
  pWVar1 = add(pWVar1,&local_508,&local_530,&local_558,(string *)local_90,&local_578,One,&local_5b0)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"--primary-output",&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"-o1",&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"Output file for the primary module.",&local_629);
  local_65c = Split;
  local_658 = &local_65c;
  local_650 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_65d);
  __l_15._M_len = local_650;
  __l_15._M_array = local_658;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_648,__l_15,&local_65d);
  local_688.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__7,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_680,&local_688);
  pWVar1 = add(pWVar1,&local_5d8,&local_600,&local_628,(string *)local_90,&local_648,One,&local_680)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"--secondary-output",&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"-o2",&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"Output file for the secondary module.",&local_6f9);
  local_72c = Split;
  local_728 = &local_72c;
  local_720 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_72d);
  __l_14._M_len = local_720;
  __l_14._M_array = local_728;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_718,__l_14,&local_72d);
  local_758.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__8,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_750,&local_758);
  pWVar1 = add(pWVar1,&local_6a8,&local_6d0,&local_6f8,(string *)local_90,&local_718,One,&local_750)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"--symbolmap",&local_779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a0,"",&local_7a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c8,"Write a symbol map file for each of the output modules.",
             &local_7c9);
  local_7fc = Split;
  local_7f8 = &local_7fc;
  local_7f0 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_7fd);
  __l_13._M_len = local_7f0;
  __l_13._M_array = local_7f8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_7e8,__l_13,&local_7fd);
  local_828.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__9,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_820,&local_828);
  pWVar1 = add(pWVar1,&local_778,&local_7a0,&local_7c8,(string *)local_90,&local_7e8,Zero,&local_820
              );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_848,"--placeholdermap",&local_849);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"",&local_871);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_898,"Write a file mapping placeholder indices to the function names.",
             &local_899);
  local_8cc = Split;
  local_8c8 = &local_8cc;
  local_8c0 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_8cd);
  __l_12._M_len = local_8c0;
  __l_12._M_array = local_8c8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_8b8,__l_12,&local_8cd);
  local_8f8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__10,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_8f0,&local_8f8);
  pWVar1 = add(pWVar1,&local_848,&local_870,&local_898,(string *)local_90,&local_8b8,Zero,&local_8f0
              );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"--import-namespace",&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"",&local_941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,
             "When provided as an option for module splitting, the namespace from which to import objects from the primary module into the secondary module. In instrument mode, refers to the namespace from which to import the secondary memory, if any."
             ,&local_969);
  local_9a0[0] = Split;
  local_9a0[1] = 1;
  local_998 = local_9a0;
  local_990 = 2;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_9a1);
  __l_11._M_len = local_990;
  __l_11._M_array = local_998;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_988,__l_11,&local_9a1);
  local_9d0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__11,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_9c8,&local_9d0);
  pWVar1 = add(pWVar1,&local_918,&local_940,&local_968,(string *)local_90,&local_988,One,&local_9c8)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,"--placeholder-namespace",&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"",&local_a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a40,
             "The namespace from which to import placeholder functions into the primary module.",
             &local_a41);
  local_a74 = Split;
  local_a70 = &local_a74;
  local_a68 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_a75);
  __l_10._M_len = local_a68;
  __l_10._M_array = local_a70;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_a60,__l_10,&local_a75);
  local_aa0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__12,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_a98,&local_aa0);
  pWVar1 = add(pWVar1,&local_9f0,&local_a18,&local_a40,(string *)local_90,&local_a60,One,&local_a98)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac0,"--jspi",&local_ac1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ae8,"",&local_ae9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b10,
             "Transform the module to support asynchronously loading the secondary module before any placeholder functions have been called."
             ,&local_b11);
  local_b44 = Split;
  local_b40 = &local_b44;
  local_b38 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_b45);
  __l_09._M_len = local_b38;
  __l_09._M_array = local_b40;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_b30,__l_09,&local_b45);
  local_b70.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__13,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_b68,&local_b70);
  pWVar1 = add(pWVar1,&local_ac0,&local_ae8,&local_b10,(string *)local_90,&local_b30,Zero,&local_b68
              );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b90,"--export-prefix",&local_b91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_bb8,"",&local_bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be0,
             "An identifying prefix to prepend to new export names created by module splitting.",
             &local_be1);
  local_c14 = Split;
  local_c10 = &local_c14;
  local_c08 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_c15);
  __l_08._M_len = local_c08;
  __l_08._M_array = local_c10;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_c00,__l_08,&local_c15);
  local_c40.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__14,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_c38,&local_c40);
  pWVar1 = add(pWVar1,&local_b90,&local_bb8,&local_be0,(string *)local_90,&local_c00,One,&local_c38)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c60,"--profile-export",&local_c61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c88,"",&local_c89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cb0,
             "The export name of the function the embedder calls to write the profile into memory. Defaults to `__write_profile`."
             ,&local_cb1);
  local_ce4 = Instrument;
  local_ce0 = &local_ce4;
  local_cd8 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_ce5);
  __l_07._M_len = local_cd8;
  __l_07._M_array = local_ce0;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_cd0,__l_07,&local_ce5);
  local_d10.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__15,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_d08,&local_d10);
  pWVar1 = add(pWVar1,&local_c60,&local_c88,&local_cb0,(string *)local_90,&local_cd0,One,&local_d08)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d30,"--in-memory",&local_d31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d58,"",&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d80,
             "Store profile information in memory (starting at address 0 and taking one byte per function) rather than globals (the default) so that it can be shared between multiple threads. Users are responsible for ensuring that the module does not use the initial memory region for anything else."
             ,&local_d81);
  local_db4 = Instrument;
  local_db0 = &local_db4;
  local_da8 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_db5);
  __l_06._M_len = local_da8;
  __l_06._M_array = local_db0;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_da0,__l_06,&local_db5);
  local_de0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__16,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_dd8,&local_de0);
  pWVar1 = add(pWVar1,&local_d30,&local_d58,&local_d80,(string *)local_90,&local_da0,Zero,&local_dd8
              );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e00,"--in-secondary-memory",&local_e01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e28,"",&local_e29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e50,
             "Store profile information in a separate memory, rather than in module main memory or globals (the default). With this option, users do not need to reserve the initial memory region for profile data and the data can be shared between multiple threads."
             ,&local_e51);
  local_e84 = Instrument;
  local_e80 = &local_e84;
  local_e78 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_e85);
  __l_05._M_len = local_e78;
  __l_05._M_array = local_e80;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_e70,__l_05,&local_e85);
  local_eb0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__17,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_ea8,&local_eb0);
  pWVar1 = add(pWVar1,&local_e00,&local_e28,&local_e50,(string *)local_90,&local_e70,Zero,&local_ea8
              );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ed0,"--secondary-memory-name",&local_ed1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ef8,"",&local_ef9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f20,
             "The name of the secondary memory created to store profile information.",&local_f21);
  local_f54 = Instrument;
  local_f50 = &local_f54;
  local_f48 = 1;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_f55);
  __l_04._M_len = local_f48;
  __l_04._M_array = local_f50;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_f40,__l_04,&local_f55);
  local_f80.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__18,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_f78,&local_f80);
  pWVar1 = add(pWVar1,&local_ed0,&local_ef8,&local_f20,(string *)local_90,&local_f40,One,&local_f78)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa0,"--emit-module-names",&local_fa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fc8,"",&local_fc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ff0,
             "Emit module names, even if not emitting the rest of the names section. Can help differentiate the modules in stack traces. This option will be removed once simpler ways of naming modules are widely available. See https://bugs.chromium.org/p/v8/issues/detail?id=11808."
             ,&local_ff1);
  local_1028[0] = Split;
  local_1028[1] = 1;
  local_1020 = local_1028;
  local_1018 = 2;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_1029);
  __l_03._M_len = local_1018;
  __l_03._M_array = local_1020;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_1010,__l_03,&local_1029);
  local_1058.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__19,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1050,&local_1058);
  pWVar1 = add(pWVar1,&local_fa0,&local_fc8,&local_ff0,(string *)local_90,&local_1010,Zero,
               &local_1050);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1078,"--initial-table",&local_1079);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10a0,"",&local_10a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10c8,
             "A hack to ensure the split and instrumented modules have the same table size when using Emscripten\'s SPLIT_MODULE mode with dynamic linking. TODO: Figure out a more elegant solution for that use case and remove this."
             ,&local_10c9);
  local_1100[0] = Split;
  local_1100[1] = 1;
  local_10f8 = local_1100;
  local_10f0 = 2;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_1101);
  __l_02._M_len = local_10f0;
  __l_02._M_array = local_10f8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_10e8,__l_02,&local_1101);
  local_1130.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__20,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1128,&local_1130);
  pWVar1 = add(pWVar1,&local_1078,&local_10a0,&local_10c8,(string *)local_90,&local_10e8,One,
               &local_1128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1150,"--emit-text",&local_1151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1178,"-S",&local_1179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11a0,"Emit text instead of binary for the output file or files.",
             &local_11a1);
  local_11d8[0] = Split;
  local_11d8[1] = 1;
  local_11d0 = local_11d8;
  local_11c8 = 2;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_11d9);
  __l_01._M_len = local_11c8;
  __l_01._M_array = local_11d0;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_11c0,__l_01,&local_11d9);
  local_1208.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__21,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1200,&local_1208);
  pWVar1 = add(pWVar1,&local_1150,&local_1178,&local_11a0,(string *)local_90,&local_11c0,Zero,
               &local_1200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1228,"--debuginfo",&local_1229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1250,"-g",&local_1251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1278,"Emit names section in wasm binary (or full debuginfo in wast)",
             &local_1279);
  local_12b0[0] = Split;
  local_12b0[1] = 1;
  local_12a8 = local_12b0;
  local_12a0 = 2;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_12b1);
  __l_00._M_len = local_12a0;
  __l_00._M_array = local_12a8;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_1298,__l_00,&local_12b1);
  local_12e0.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__22,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_12d8,&local_12e0);
  pWVar1 = add(pWVar1,&local_1228,&local_1250,&local_1278,(string *)local_90,&local_1298,Zero,
               &local_12d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1300,"--output",&local_1301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1328,"-o",&local_1329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1350,"Output file.",&local_1351);
  local_1388[0] = Instrument;
  local_1388[1] = 2;
  local_1380 = local_1388;
  local_1378 = 2;
  std::allocator<wasm::WasmSplitOptions::Mode>::allocator(&local_1389);
  __l._M_len = local_1378;
  __l._M_array = local_1380;
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::vector
            (&local_1370,__l,&local_1389);
  local_13b8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__23,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_13b0,&local_13b8);
  pWVar1 = add(pWVar1,&local_1300,&local_1328,&local_1350,(string *)local_90,&local_1370,One,
               &local_13b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_13d8,"--unescape",&local_13d9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1400,"-u",&local_1401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1428,"Un-escape function names (in print-profile output)",&local_1429)
  ;
  local_1458.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__24,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1450,&local_1458);
  pWVar1 = add(pWVar1,&local_13d8,&local_1400,&local_1428,(string *)local_90,Zero,&local_1450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1478,"--verbose",&local_1479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14a0,"-v",&local_14a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,
             "Verbose output mode. Prints the functions that will be kept and split out when splitting a module."
             ,&local_14c9);
  local_14f8.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__25,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_14f0,&local_14f8);
  pWVar1 = add(pWVar1,&local_1478,&local_14a0,&local_14c8,(string *)local_90,Zero,&local_14f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1518,"INFILES",&local_1519);
  local_1548.this = this;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
  function<wasm::WasmSplitOptions::WasmSplitOptions()::__26,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_1540,&local_1548);
  ::wasm::Options::add_positional((string *)pWVar1,(Arguments)local_1518,(function *)0x2);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1540);
  std::__cxx11::string::~string(local_1518);
  std::allocator<char>::~allocator(&local_1519);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_14f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::allocator<char>::~allocator(&local_14c9);
  std::__cxx11::string::~string((string *)&local_14a0);
  std::allocator<char>::~allocator(&local_14a1);
  std::__cxx11::string::~string((string *)&local_1478);
  std::allocator<char>::~allocator(&local_1479);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1450);
  std::__cxx11::string::~string((string *)&local_1428);
  std::allocator<char>::~allocator(&local_1429);
  std::__cxx11::string::~string((string *)&local_1400);
  std::allocator<char>::~allocator(&local_1401);
  std::__cxx11::string::~string((string *)&local_13d8);
  std::allocator<char>::~allocator(&local_13d9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_13b0);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_1370);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_1389);
  std::__cxx11::string::~string((string *)&local_1350);
  std::allocator<char>::~allocator(&local_1351);
  std::__cxx11::string::~string((string *)&local_1328);
  std::allocator<char>::~allocator(&local_1329);
  std::__cxx11::string::~string((string *)&local_1300);
  std::allocator<char>::~allocator(&local_1301);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_12d8);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_1298);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_12b1);
  std::__cxx11::string::~string((string *)&local_1278);
  std::allocator<char>::~allocator(&local_1279);
  std::__cxx11::string::~string((string *)&local_1250);
  std::allocator<char>::~allocator(&local_1251);
  std::__cxx11::string::~string((string *)&local_1228);
  std::allocator<char>::~allocator(&local_1229);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1200);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_11c0);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_11d9);
  std::__cxx11::string::~string((string *)&local_11a0);
  std::allocator<char>::~allocator(&local_11a1);
  std::__cxx11::string::~string((string *)&local_1178);
  std::allocator<char>::~allocator(&local_1179);
  std::__cxx11::string::~string((string *)&local_1150);
  std::allocator<char>::~allocator(&local_1151);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1128);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_10e8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_1101);
  std::__cxx11::string::~string((string *)&local_10c8);
  std::allocator<char>::~allocator(&local_10c9);
  std::__cxx11::string::~string((string *)&local_10a0);
  std::allocator<char>::~allocator(&local_10a1);
  std::__cxx11::string::~string((string *)&local_1078);
  std::allocator<char>::~allocator(&local_1079);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1050);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_1010);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_1029);
  std::__cxx11::string::~string((string *)&local_ff0);
  std::allocator<char>::~allocator(&local_ff1);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::allocator<char>::~allocator(&local_fc9);
  std::__cxx11::string::~string((string *)&local_fa0);
  std::allocator<char>::~allocator(&local_fa1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_f78);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_f40);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_f55);
  std::__cxx11::string::~string((string *)&local_f20);
  std::allocator<char>::~allocator(&local_f21);
  std::__cxx11::string::~string((string *)&local_ef8);
  std::allocator<char>::~allocator(&local_ef9);
  std::__cxx11::string::~string((string *)&local_ed0);
  std::allocator<char>::~allocator(&local_ed1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_ea8);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_e70);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_e85);
  std::__cxx11::string::~string((string *)&local_e50);
  std::allocator<char>::~allocator(&local_e51);
  std::__cxx11::string::~string((string *)&local_e28);
  std::allocator<char>::~allocator(&local_e29);
  std::__cxx11::string::~string((string *)&local_e00);
  std::allocator<char>::~allocator(&local_e01);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_dd8);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_da0);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_db5);
  std::__cxx11::string::~string((string *)&local_d80);
  std::allocator<char>::~allocator(&local_d81);
  std::__cxx11::string::~string((string *)&local_d58);
  std::allocator<char>::~allocator(&local_d59);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator(&local_d31);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_d08);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_cd0);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_ce5);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::allocator<char>::~allocator(&local_cb1);
  std::__cxx11::string::~string((string *)&local_c88);
  std::allocator<char>::~allocator(&local_c89);
  std::__cxx11::string::~string((string *)&local_c60);
  std::allocator<char>::~allocator(&local_c61);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c38);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_c00);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_c15);
  std::__cxx11::string::~string((string *)&local_be0);
  std::allocator<char>::~allocator(&local_be1);
  std::__cxx11::string::~string((string *)&local_bb8);
  std::allocator<char>::~allocator(&local_bb9);
  std::__cxx11::string::~string((string *)&local_b90);
  std::allocator<char>::~allocator(&local_b91);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b68);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_b30);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_b45);
  std::__cxx11::string::~string((string *)&local_b10);
  std::allocator<char>::~allocator(&local_b11);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::allocator<char>::~allocator(&local_ae9);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::allocator<char>::~allocator(&local_ac1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_a98);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_a60);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_a75);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator(&local_a19);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_9c8);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_988);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_9a1);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator(&local_969);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator(&local_941);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_8f0);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_8b8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_8cd);
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator(&local_899);
  std::__cxx11::string::~string((string *)&local_870);
  std::allocator<char>::~allocator(&local_871);
  std::__cxx11::string::~string((string *)&local_848);
  std::allocator<char>::~allocator(&local_849);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_820);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_7e8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_7fd);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::allocator<char>::~allocator(&local_7c9);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_750);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_718);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_72d);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_680);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_648);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_65d);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_5b0);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_578);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_58d);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4e0);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_4a8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_4bd);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_410);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_3d8);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_3ed);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_340);
  std::vector<wasm::WasmSplitOptions::Mode,_std::allocator<wasm::WasmSplitOptions::Mode>_>::~vector
            (&local_308);
  std::allocator<wasm::WasmSplitOptions::Mode>::~allocator(&local_31d);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_270);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1d0);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_130);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

WasmSplitOptions::WasmSplitOptions()
  : ToolOptions("wasm-split",
                "Split a module into a primary module and a secondary "
                "module, or instrument a module to gather a profile that "
                "can inform future splitting, or manage such profiles. Options "
                "that are only accepted in particular modes are marked with "
                "the accepted \"[<modes>]\" in their descriptions.") {
  const std::string WasmSplitOption = "wasm-split options";

  (*this)
    .add("--split",
         "",
         "Split an input module into two output modules. The default mode.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arugment) { mode = Mode::Split; })
    .add(
      "--instrument",
      "",
      "Instrument an input module to allow it to generate a profile that can"
      " be used to guide splitting.",
      WasmSplitOption,
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { mode = Mode::Instrument; })
    .add("--merge-profiles",
         "",
         "Merge multiple profiles for the same module into a single profile.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           mode = Mode::MergeProfiles;
         })
    .add("--print-profile",
         "",
         "Print profile contents in a human-readable format.",
         WasmSplitOption,
         {Mode::PrintProfile},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           mode = Mode::PrintProfile;
           profileFile = argument;
         })
    .add(
      "--profile",
      "",
      "The profile to use to guide splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { profileFile = argument; })
    .add("--keep-funcs",
         "",
         "Comma-separated list of functions to keep in the primary module. The "
         "rest will be split out. Cannot be used with --profile or "
         "--split-funcs. You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           keepFuncs = parseNameList(argument);
         })
    .add("--split-funcs",
         "",
         "Comma-separated list of functions to split out to the secondary "
         "module. The rest will be kept. Cannot be used with --profile or "
         "--keep-funcs. You can also pass a file with one function per line "
         "by passing @filename.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           splitFuncs = parseNameList(argument);
         })
    .add("--primary-output",
         "-o1",
         "Output file for the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           primaryOutput = argument;
         })
    .add("--secondary-output",
         "-o2",
         "Output file for the secondary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryOutput = argument;
         })
    .add("--symbolmap",
         "",
         "Write a symbol map file for each of the output modules.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { symbolMap = true; })
    .add(
      "--placeholdermap",
      "",
      "Write a file mapping placeholder indices to the function names.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) { placeholderMap = true; })
    .add("--import-namespace",
         "",
         "When provided as an option for module splitting, the namespace from "
         "which to import objects from the primary "
         "module into the secondary module. In instrument mode, refers to the "
         "namespace from which to import the secondary memory, if any.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           importNamespace = argument;
         })
    .add("--placeholder-namespace",
         "",
         "The namespace from which to import placeholder functions into "
         "the primary module.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           placeholderNamespace = argument;
         })
    .add("--jspi",
         "",
         "Transform the module to support asynchronously loading the secondary "
         "module before any placeholder functions have been called.",
         WasmSplitOption,
         {Mode::Split},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { jspi = true; })
    .add(
      "--export-prefix",
      "",
      "An identifying prefix to prepend to new export names created "
      "by module splitting.",
      WasmSplitOption,
      {Mode::Split},
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { exportPrefix = argument; })
    .add("--profile-export",
         "",
         "The export name of the function the embedder calls to write the "
         "profile into memory. Defaults to `__write_profile`.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           profileExport = argument;
         })
    .add(
      "--in-memory",
      "",
      "Store profile information in memory (starting at address 0 and taking "
      "one byte per function) rather than globals (the default) so that "
      "it can be shared between multiple threads. Users are responsible for "
      "ensuring that the module does not use the initial memory region for "
      "anything else.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InMemory;
      })
    .add(
      "--in-secondary-memory",
      "",
      "Store profile information in a separate memory, rather than in module "
      "main memory or globals (the default). With this option, users do not "
      "need to reserve the initial memory region for profile data and the "
      "data can be shared between multiple threads.",
      WasmSplitOption,
      {Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& argument) {
        storageKind = StorageKind::InSecondaryMemory;
      })
    .add("--secondary-memory-name",
         "",
         "The name of the secondary memory created to store profile "
         "information.",
         WasmSplitOption,
         {Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           secondaryMemoryName = argument;
         })
    .add(
      "--emit-module-names",
      "",
      "Emit module names, even if not emitting the rest of the names section. "
      "Can help differentiate the modules in stack traces. This option will be "
      "removed once simpler ways of naming modules are widely available. See "
      "https://bugs.chromium.org/p/v8/issues/detail?id=11808.",
      WasmSplitOption,
      {Mode::Split, Mode::Instrument},
      Options::Arguments::Zero,
      [&](Options* o, const std::string& arguments) { emitModuleNames = true; })
    .add("--initial-table",
         "",
         "A hack to ensure the split and instrumented modules have the same "
         "table size when using Emscripten's SPLIT_MODULE mode with dynamic "
         "linking. TODO: Figure out a more elegant solution for that use "
         "case and remove this.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           initialTableSize = std::stoi(argument);
         })
    .add("--emit-text",
         "-S",
         "Emit text instead of binary for the output file or files.",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { emitBinary = false; })
    .add("--debuginfo",
         "-g",
         "Emit names section in wasm binary (or full debuginfo in wast)",
         WasmSplitOption,
         {Mode::Split, Mode::Instrument},
         Options::Arguments::Zero,
         [&](Options* o, const std::string& arguments) {
           passOptions.debugInfo = true;
         })
    .add("--output",
         "-o",
         "Output file.",
         WasmSplitOption,
         {Mode::Instrument, Mode::MergeProfiles},
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { output = argument; })
    .add("--unescape",
         "-u",
         "Un-escape function names (in print-profile output)",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { unescape = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode. Prints the functions that will be kept "
         "and split out when splitting a module.",
         WasmSplitOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           verbose = true;
           quiet = false;
         })
    .add_positional("INFILES",
                    Options::Arguments::N,
                    [&](Options* o, const std::string& argument) {
                      inputFiles.push_back(argument);
                    });
}